

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++:90:13)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *pEVar1;
  Response<capnp::AnyPointer> *t;
  Response<capnp::AnyPointer> *func;
  Response<capnp::DynamicStruct> local_630;
  ExceptionOr<capnp::Response<capnp::DynamicStruct>_> local_5e8;
  Response<capnp::AnyPointer> *local_400;
  Response<capnp::AnyPointer> *depValue;
  Response<capnp::AnyPointer> *_depValue779;
  Exception *local_208;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1e8 [8];
  ExceptionOr<capnp::Response<capnp::AnyPointer>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13)>
  *this_local;
  
  depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)output;
  ExceptionOr<capnp::Response<capnp::AnyPointer>_>::ExceptionOr
            ((ExceptionOr<capnp::Response<capnp::AnyPointer>_> *)local_1e8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1e8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1e8);
  if (depException == (Exception *)0x0) {
    t = readMaybe<capnp::Response<capnp::AnyPointer>>
                  ((Maybe<capnp::Response<capnp::AnyPointer>_> *)
                   ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.
                           builder + 0x18));
    depValue = t;
    if (t != (Response<capnp::AnyPointer> *)0x0) {
      local_400 = t;
      func = mv<capnp::Response<capnp::AnyPointer>>(t);
      MaybeVoidCaller<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::DynamicStruct>>::
      apply<capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0>
                (&local_630,
                 (MaybeVoidCaller<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::DynamicStruct>>
                  *)&this->func,(Type *)func,t);
      TransformPromiseNodeBase::handle<capnp::Response<capnp::DynamicStruct>>
                (&local_5e8,&this->super_TransformPromiseNodeBase,&local_630);
      pEVar1 = ExceptionOrValue::as<capnp::Response<capnp::DynamicStruct>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
      ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=(pEVar1,&local_5e8);
      ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::~ExceptionOr(&local_5e8);
      ::capnp::Response<capnp::DynamicStruct>::~Response(&local_630);
    }
  }
  else {
    local_208 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::ExceptionOr
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)&_depValue779,false,exception)
    ;
    pEVar1 = ExceptionOrValue::as<capnp::Response<capnp::DynamicStruct>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::operator=
              (pEVar1,(ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)&_depValue779);
    ExceptionOr<capnp::Response<capnp::DynamicStruct>_>::~ExceptionOr
              ((ExceptionOr<capnp::Response<capnp::DynamicStruct>_> *)&_depValue779);
  }
  ExceptionOr<capnp::Response<capnp::AnyPointer>_>::~ExceptionOr
            ((ExceptionOr<capnp::Response<capnp::AnyPointer>_> *)local_1e8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }